

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbift3.cpp
# Opt level: O3

void CVmBifT3::get_named_arg_list(uint argc)

{
  CVmObjPageEntry *this;
  vm_obj_id_t vVar1;
  ushort *puVar2;
  ulong uVar3;
  long lVar4;
  uint16_t tmp;
  size_t idx;
  vm_val_t *pvVar5;
  vm_val_t *argp;
  vm_val_t str;
  vm_val_t *local_48;
  vm_val_t local_40;
  
  CVmBif::check_argc(argc,0);
  pvVar5 = sp_;
  sp_ = sp_ + 1;
  vVar1 = CVmObjList::create(0,10);
  pvVar5->typ = VM_OBJ;
  (pvVar5->val).obj = vVar1;
  this = G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff);
  uVar3 = (ulong)**(ushort **)((long)&this->ptr_ + 8);
  if (uVar3 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this,0,uVar3 - 1);
  }
  idx = 0;
  if (frame_ptr_ != (vm_val_t *)0x0) {
    pvVar5 = frame_ptr_;
    do {
      puVar2 = (ushort *)CVmRun::get_named_args_from_frame(pvVar5,&local_48);
      if (puVar2 != (ushort *)0x0) {
        lVar4 = (ulong)*puVar2 - 1;
        local_48 = local_48 + lVar4;
        if ((ulong)*puVar2 != 0) {
          idx = (size_t)(int)idx;
          lVar4 = (ulong)(uint)((int)lVar4 * 2) + 2;
          do {
            local_40.val.obj =
                 CVmObjString::create
                           (0,(char *)((long)puVar2 + (ulong)*(ushort *)((long)puVar2 + lVar4) + 2),
                            (ulong)((uint)*(ushort *)((long)puVar2 + lVar4 + 2) -
                                   (uint)*(ushort *)((long)puVar2 + lVar4)));
            local_40.typ = VM_OBJ;
            CVmObjList::cons_ensure_space((CVmObjList *)this,idx,10);
            CVmObjList::cons_set_element((CVmObjList *)this,idx,&local_40);
            local_48 = local_48 + -1;
            idx = idx + 1;
            lVar4 = lVar4 + -2;
          } while (1 < (int)lVar4);
        }
      }
      pvVar5 = (vm_val_t *)pvVar5[-1].val.native_desc;
    } while (pvVar5 != (vm_val_t *)0x0);
  }
  *(short *)*(char **)((long)&this->ptr_ + 8) = (short)idx;
  CVmObjList::cons_uniquify((CVmObjList *)this);
  CVmBif::retval_pop();
  return;
}

Assistant:

void CVmBifT3::get_named_arg_list(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 0);
    
    /* create the result list; we'll expand as necessary later */
    G_stk->push()->set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ G_stk->get(0)->val.obj);

    /* clear it out, since we're building it incrementally */
    lst->cons_clear();

    /* we haven't added any elements yet */
    int idx = 0;

    /* scan the stack and populate the name list from the tables we find */
    for (vm_val_t *fp = G_interpreter->get_frame_ptr() ; fp != 0 ;
         fp = G_interpreter->get_enclosing_frame_ptr(vmg_ fp))
    {
        /* look for a named argument table in this frame */
        vm_val_t *argp;
        const uchar *t = CVmRun::get_named_args_from_frame(vmg_ fp, &argp);
        if (t != 0)
        {
            /* get the number of table entries */
            int n = osrp2(t);
            t += 2;

            /* 
             *   Build the list.  The compiler generates the list in
             *   right-to-left order (the order of pushing the arguments).
             *   For readability, reverse this: generate the list left to
             *   right, so that it appears in the original source code order.
             */
            argp += n - 1;
            for (int i = (n-1)*2 ; i >= 0 ; i -= 2, --argp)
            {
                /* get this string's offset and figure its length */
                uint ofs = osrp2(t + i);
                uint len = osrp2(t + i + 2) - ofs;
                
                /* create a string from the name */
                vm_val_t str;
                str.set_obj(CVmObjString::create(
                    vmg_ FALSE, (const char *)t + ofs, len));

                /* add it to the list */
                lst->cons_ensure_space(vmg_ idx, 10);
                lst->cons_set_element(idx, &str);
                ++idx;
            }
        }
    }

    /* set the final list length */
    lst->cons_set_len(idx);

    /* keep only the unique elements */
    lst->cons_uniquify(vmg0_);

    /* return the results */
    retval_pop(vmg0_);
}